

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

void source(char *src)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *pcVar4;
  char *pcVar5;
  DirHandle *dir;
  time_t tVar6;
  char *pcVar7;
  uint64_t done;
  ulong uVar8;
  ulong uVar9;
  uint64_t size;
  long permissions;
  unsigned_long atime;
  unsigned_long mtime;
  char transbuf [4096];
  uint64_t local_1088;
  RFile *local_1080;
  char *local_1078;
  time_t local_1070;
  uint64_t local_1068;
  time_t local_1060;
  char *local_1058;
  wchar_t local_1050 [2];
  unsigned_long local_1048;
  unsigned_long local_1040;
  char *local_1038 [513];
  
  iVar1 = file_type(src);
  if (iVar1 != 3) {
    if (iVar1 == 2) {
      if (recursive != '\x01') {
        run_err("%s: not a regular file",src);
        return;
      }
      pcVar4 = strrchr(src,0x2f);
      pcVar7 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        pcVar7 = strrchr(src,0x5c);
      }
      pcVar5 = pcVar7 + 1;
      if (pcVar7 == (char *)0x0) {
        pcVar5 = src;
      }
      if ((*pcVar5 != '.') || ((pcVar5[1] != '\0' && ((pcVar5[1] != '.' || (pcVar5[2] != '\0'))))))
      {
        pcVar7 = pcVar4 + 1;
        if (pcVar4 == (char *)0x0) {
          pcVar7 = src;
        }
        pcVar5 = strrchr(pcVar7,0x5c);
        pcVar4 = pcVar5 + 1;
        if (pcVar5 == (char *)0x0) {
          pcVar4 = pcVar7;
        }
        if (pcVar4 == src) {
          pcVar7 = strchr(src,0x3a);
          if (pcVar7 != (char *)0x0) {
            pcVar4 = pcVar7 + 1;
          }
        }
        pcVar7 = scp_sftp_remotepath;
        if (using_sftp == false) {
          pcVar7 = (char *)0x0;
        }
        if (verbose == '\x01') {
          tell_user(_stderr,"Entering directory: %s",pcVar4);
        }
        wVar2 = scp_send_dirname(pcVar4,L'ǭ');
        if (wVar2 == L'\0') {
          dir = open_directory(src,local_1038);
          if (dir == (DirHandle *)0x0) {
            tell_user(_stderr,"Error opening directory %s: %s",src,local_1038[0]);
          }
          else {
            pcVar4 = read_filename(dir);
            while (pcVar4 != (char *)0x0) {
              pcVar5 = dupcat_fn(src,"/",pcVar4,0);
              source(pcVar5);
              safefree(pcVar5);
              safefree(pcVar4);
              pcVar4 = read_filename(dir);
            }
            close_directory(dir);
          }
          scp_send_enddir();
          if (using_sftp == true) {
            scp_sftp_remotepath = pcVar7;
          }
        }
      }
    }
    else {
      if (iVar1 == 0) goto LAB_0011223a;
      pcVar4 = strrchr(src,0x2f);
      pcVar7 = pcVar4 + 1;
      if (pcVar4 == (char *)0x0) {
        pcVar7 = src;
      }
      pcVar5 = strrchr(pcVar7,0x5c);
      pcVar4 = pcVar5 + 1;
      if (pcVar5 == (char *)0x0) {
        pcVar4 = pcVar7;
      }
      if (pcVar4 == src) {
        pcVar7 = strchr(src,0x3a);
        if (pcVar7 != (char *)0x0) {
          pcVar4 = pcVar7 + 1;
        }
      }
      local_1080 = open_existing_file(src,&local_1088,&local_1040,&local_1048,(long *)local_1050);
      if (local_1080 == (RFile *)0x0) {
        run_err("%s: Cannot open file",src);
      }
      else {
        if ((preserve != '\x01') ||
           (wVar2 = scp_send_filetimes(local_1040,local_1048), wVar2 == L'\0')) {
          if (verbose == '\x01') {
            tell_user(_stderr,"Sending file %s, size=%lu",pcVar4,local_1088);
          }
          wVar2 = scp_send_filename(pcVar4,local_1088,local_1050[0]);
          if (wVar2 == L'\0') {
            iVar1 = 0;
            local_1078 = src;
            local_1058 = pcVar4;
            local_1060 = time((time_t *)0x0);
            if (local_1088 != 0) {
              local_1070 = 0;
              local_1068 = 0;
              uVar8 = 0;
              do {
                uVar9 = uVar8 + 0x1000;
                wVar2 = (int)local_1088 + iVar1;
                if (uVar9 <= local_1088) {
                  wVar2 = L'က';
                }
                wVar3 = read_from_file(local_1080,local_1038,wVar2);
                if (wVar3 != wVar2) {
                  pcVar7 = "%s: Read error";
LAB_0011264d:
                  bump(pcVar7,local_1078);
                }
                wVar3 = scp_send_filedata((char *)local_1038,wVar2);
                if (wVar3 != L'\0') {
                  pcVar7 = "%s: Network error occurred";
                  goto LAB_0011264d;
                }
                if (statistics == '\0') {
                  done = local_1068 + (long)wVar2;
                  tVar6 = time((time_t *)0x0);
                  local_1068 = done;
                  if ((tVar6 != local_1070) || (uVar8 + (long)wVar2 == local_1088)) {
                    local_1070 = time((time_t *)0x0);
                    print_stats(local_1058,local_1088,done,local_1060,local_1070);
                  }
                }
                iVar1 = iVar1 + -0x1000;
                uVar8 = uVar9;
              } while (uVar9 < local_1088);
            }
            close_rfile(local_1080);
            scp_send_finish();
            return;
          }
        }
        close_rfile(local_1080);
      }
    }
    return;
  }
LAB_0011223a:
  pcVar7 = "No such";
  if (iVar1 == 3) {
    pcVar7 = "Not a";
  }
  run_err("%s: %s file or directory",src,pcVar7);
  return;
}

Assistant:

static void source(const char *src)
{
    uint64_t size;
    unsigned long mtime, atime;
    long permissions;
    const char *last;
    RFile *f;
    int attr;
    uint64_t i;
    uint64_t stat_bytes;
    time_t stat_starttime, stat_lasttime;

    attr = file_type(src);
    if (attr == FILE_TYPE_NONEXISTENT ||
        attr == FILE_TYPE_WEIRD) {
        run_err("%s: %s file or directory", src,
                (attr == FILE_TYPE_WEIRD ? "Not a" : "No such"));
        return;
    }

    if (attr == FILE_TYPE_DIRECTORY) {
        if (recursive) {
            /*
             * Avoid . and .. directories.
             */
            const char *p;
            p = strrchr(src, '/');
            if (!p)
                p = strrchr(src, '\\');
            if (!p)
                p = src;
            else
                p++;
            if (!strcmp(p, ".") || !strcmp(p, ".."))
                /* skip . and .. */ ;
            else
                rsource(src);
        } else {
            run_err("%s: not a regular file", src);
        }
        return;
    }

    if ((last = strrchr(src, '/')) == NULL)
        last = src;
    else
        last++;
    if (strrchr(last, '\\') != NULL)
        last = strrchr(last, '\\') + 1;
    if (last == src && strchr(src, ':') != NULL)
        last = strchr(src, ':') + 1;

    f = open_existing_file(src, &size, &mtime, &atime, &permissions);
    if (f == NULL) {
        run_err("%s: Cannot open file", src);
        return;
    }
    if (preserve) {
        if (scp_send_filetimes(mtime, atime)) {
            close_rfile(f);
            return;
        }
    }

    if (verbose) {
        tell_user(stderr, "Sending file %s, size=%"PRIu64, last, size);
    }
    if (scp_send_filename(last, size, permissions)) {
        close_rfile(f);
        return;
    }

    stat_bytes = 0;
    stat_starttime = time(NULL);
    stat_lasttime = 0;

#define PSCP_SEND_BLOCK 4096
    for (i = 0; i < size; i += PSCP_SEND_BLOCK) {
        char transbuf[PSCP_SEND_BLOCK];
        int j, k = PSCP_SEND_BLOCK;

        if (i + k > size)
            k = size - i;
        if ((j = read_from_file(f, transbuf, k)) != k) {
            bump("%s: Read error", src);
        }
        if (scp_send_filedata(transbuf, k))
            bump("%s: Network error occurred", src);

        if (statistics) {
            stat_bytes += k;
            if (time(NULL) != stat_lasttime || i + k == size) {
                stat_lasttime = time(NULL);
                print_stats(last, size, stat_bytes,
                            stat_starttime, stat_lasttime);
            }
        }

    }
    close_rfile(f);

    (void) scp_send_finish();
}